

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::toString(QString *__return_storage_ptr__,QLocale *this,QDate date,FormatType format,
                 QCalendar cal)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  long in_FS_OFFSET;
  QStringView format_00;
  QCalendar local_80;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.d_ptr = cal.d_ptr;
  if (0x16d3e147973 < date.jd + 0xb69eeff91fU) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0030b7e3;
  }
  bVar1 = QCalendar::isGregorian(&local_80);
  if ((bVar1) && (((this->d).d.ptr)->m_data == &systemLocaleData)) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    ::QVariant::QVariant(&local_78,date);
    (*pQVar2->_vptr_QSystemLocale[2])
              (&local_58,pQVar2,(ulong)(0x12 - (format == LongFormat)),&local_78);
    ::QVariant::~QVariant(&local_78);
    bVar1 = ::QVariant::isNull((QVariant *)&local_58);
    if (bVar1) {
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_0030b6c3;
    }
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
LAB_0030b6c3:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    dateFormat((QString *)&local_58,this,format);
    format_00.m_data = (storage_type_conflict *)local_58._8_8_;
    format_00.m_size = local_58._16_8_;
    toString(__return_storage_ptr__,this,date,format_00,local_80);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0030b7e3:
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(QDate date, FormatType format, QCalendar cal) const
{
    if (!date.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (cal.isGregorian() && d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateToStringLong
                                             : QSystemLocale::DateToStringShort,
                                             date);
        if (!res.isNull())
            return res.toString();
    }
#endif

    QString format_str = dateFormat(format);
    return toString(date, format_str, cal);
}